

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.h
# Opt level: O3

void __thiscall libchars::command::~command(command *this)

{
  command *this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this_00 = this->next;
  if (this_00 != (command *)0x0) {
    ~command(this_00);
  }
  operator_delete(this_00,0x98);
  std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::~vector(&this->par);
  pcVar1 = (this->help)._M_dataplus._M_p;
  paVar2 = &(this->help).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->cmd_str)._M_dataplus._M_p;
  paVar2 = &(this->cmd_str).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  paVar2 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~command() { delete next; }